

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O1

ZyanStatus
ZydisDecodeOperandMemory
          (ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operand,ZydisRegisterClass vidx_register_class)

{
  byte bVar1;
  ZyanI64 ZVar2;
  ZyanU8 ZVar3;
  ZydisRegister ZVar4;
  ZydisRegisterClass ZVar5;
  ZyanU8 ZVar6;
  ZydisRegister ZVar7;
  
  if (operand == (ZydisDecodedOperand *)0x0) {
    __assert_fail("operand",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x4f3,
                  "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                 );
  }
  if ((instruction->attributes & 1) == 0) {
    __assert_fail("instruction->attributes & (1ULL << 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x4f4,
                  "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                 );
  }
  if ((instruction->raw).modrm.mod == '\x03') {
    __assert_fail("instruction->raw.modrm.mod != 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x4f5,
                  "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                 );
  }
  if ((vidx_register_class != ZYDIS_REGCLASS_INVALID) &&
     (((instruction->raw).modrm.rm != '\x04' ||
      ((instruction->address_width != ' ' && (instruction->address_width != '@')))))) {
    __assert_fail("!vidx_register_class || ((instruction->raw.modrm.rm == 4) && ((instruction->address_width == 32) || (instruction->address_width == 64)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x4f7,
                  "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                 );
  }
  operand->type = ZYDIS_OPERAND_TYPE_MEMORY;
  (operand->field_10).mem.type = ZYDIS_MEMOP_TYPE_MEM;
  bVar1 = (instruction->raw).modrm.rm;
  ZVar4 = (ZydisRegister)bVar1;
  ZVar3 = instruction->address_width;
  if (ZVar3 == '@') {
    (operand->field_10).mem.base = (context->reg_info).id_base + ZYDIS_REGISTER_RAX;
    ZVar3 = (instruction->raw).modrm.mod;
    if (ZVar3 == '\x02') {
LAB_0011449f:
      ZVar6 = ' ';
    }
    else {
      ZVar6 = '\b';
      if (ZVar3 != '\x01') {
        if (ZVar3 != '\0') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x576,
                        "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                       );
        }
        ZVar6 = '\0';
        if (bVar1 == 5) {
          ZVar4 = ZYDIS_REGISTER_NONE;
          if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
            ZVar4 = ZYDIS_REGISTER_RIP;
          }
          (operand->field_10).mem.base = ZVar4;
          goto LAB_0011449f;
        }
      }
    }
    ZVar4 = (ZydisRegister)(bVar1 & 7);
    if ((bVar1 & 7) != 4) goto LAB_00114538;
    if ((instruction->attributes & 2) == 0) {
      __assert_fail("instruction->attributes & (1ULL << 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x57a,
                    "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                   );
    }
    ZVar5 = ZYDIS_REGCLASS_GPR64;
    if (vidx_register_class != ZYDIS_REGCLASS_INVALID) {
      ZVar5 = vidx_register_class;
    }
    ZVar3 = ZydisCalcRegisterId(context,instruction,
                                vidx_register_class == ZYDIS_REGCLASS_INVALID ^
                                ZYDIS_REG_ENCODING_VIDX,ZVar5);
    ZVar4 = ZydisRegisterEncode(ZVar5,ZVar3);
    (operand->field_10).mem.index = ZVar4;
    (operand->field_10).mem.scale = (ZyanU8)(1 << ((instruction->raw).sib.scale & 0x1f));
    if (ZVar4 == ZYDIS_REGISTER_RSP) {
      (operand->field_10).mem.index = ZYDIS_REGISTER_NONE;
      (operand->field_10).mem.scale = '\0';
    }
    ZVar4 = (operand->field_10).mem.base;
    if ((ZVar4 != ZYDIS_REGISTER_R13) && (ZVar4 != ZYDIS_REGISTER_RBP)) goto LAB_00114543;
  }
  else {
    if (ZVar3 != ' ') {
      if (ZVar3 != '\x10') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x597,
                      "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                     );
      }
      (operand->field_10).mem.base =
           *(ZydisRegister *)((long)ZydisDecodeOperandMemory::bases + (ulong)((uint)bVar1 * 4));
      (operand->field_10).mem.index =
           *(ZydisRegister *)((long)ZydisDecodeOperandMemory::indices + (ulong)((uint)bVar1 * 4));
      (operand->field_10).mem.scale = (bVar1 & 0xfc) != 4;
      ZVar3 = (instruction->raw).modrm.mod;
      if (ZVar3 != '\x02') {
        ZVar6 = '\b';
        if (ZVar3 == '\x01') goto LAB_00114543;
        if (ZVar3 != '\0') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x51f,
                        "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                       );
        }
        if (bVar1 != 6) {
          ZVar6 = '\0';
          goto LAB_00114543;
        }
        (operand->field_10).mem.base = ZYDIS_REGISTER_NONE;
      }
      ZVar6 = '\x10';
      goto LAB_00114543;
    }
    (operand->field_10).mem.base = (context->reg_info).id_base + ZYDIS_REGISTER_EAX;
    ZVar3 = (instruction->raw).modrm.mod;
    if (ZVar3 == '\x02') {
LAB_001143ef:
      ZVar6 = ' ';
    }
    else {
      ZVar6 = '\b';
      if (ZVar3 != '\x01') {
        if (ZVar3 != '\0') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x53d,
                        "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                       );
        }
        ZVar6 = '\0';
        if (bVar1 == 5) {
          ZVar7 = ZYDIS_REGISTER_NONE;
          if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
            ZVar7 = ZYDIS_REGISTER_EIP;
          }
          (operand->field_10).mem.base = ZVar7;
          goto LAB_001143ef;
        }
      }
    }
    if (bVar1 != 4) {
LAB_00114538:
      (operand->field_10).mem.index = ZYDIS_REGISTER_NONE;
      (operand->field_10).mem.scale = '\0';
      goto LAB_00114543;
    }
    if ((instruction->attributes & 2) == 0) {
      __assert_fail("instruction->attributes & (1ULL << 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x541,
                    "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                   );
    }
    ZVar5 = ZYDIS_REGCLASS_GPR32;
    if (vidx_register_class != ZYDIS_REGCLASS_INVALID) {
      ZVar5 = vidx_register_class;
    }
    ZVar3 = ZydisCalcRegisterId(context,instruction,
                                vidx_register_class == ZYDIS_REGCLASS_INVALID ^
                                ZYDIS_REG_ENCODING_VIDX,ZVar5);
    ZVar4 = ZydisRegisterEncode(ZVar5,ZVar3);
    (operand->field_10).mem.index = ZVar4;
    (operand->field_10).mem.scale = (ZyanU8)(1 << ((instruction->raw).sib.scale & 0x1f));
    if (ZVar4 == ZYDIS_REGISTER_ESP) {
      (operand->field_10).mem.index = ZYDIS_REGISTER_NONE;
      (operand->field_10).mem.scale = '\0';
    }
    if ((operand->field_10).mem.base != ZYDIS_REGISTER_EBP) goto LAB_00114543;
  }
  if ((instruction->raw).modrm.mod == '\0') {
    (operand->field_10).mem.base = ZYDIS_REGISTER_NONE;
  }
  ZVar4 = ZYDIS_REGISTER_BH;
  ZVar6 = ' ';
  if ((instruction->raw).modrm.mod == '\x01') {
    ZVar6 = '\b';
  }
LAB_00114543:
  if (ZVar6 != '\0') {
    if ((instruction->raw).disp.size != ZVar6) {
      __assert_fail("instruction->raw.disp.size == displacement_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x59b,
                    "ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, ZydisRegisterClass)"
                   );
    }
    ZVar2 = (instruction->raw).disp.value;
    (operand->field_10).mem.disp.value = ZVar2;
    *(ZyanU8 *)((long)&operand->field_10 + 0x21) = ZVar6;
    ZVar3 = (instruction->raw).disp.offset;
    ZVar4 = (ZydisRegister)CONCAT71((int7)((ulong)ZVar2 >> 8),ZVar3);
    *(ZyanU8 *)((long)&operand->field_10 + 0x20) = ZVar3;
  }
  return ZVar4;
}

Assistant:

static ZyanStatus ZydisDecodeOperandMemory(const ZydisDecoderContext* context,
    const ZydisDecodedInstruction* instruction, ZydisDecodedOperand* operand,
    ZydisRegisterClass vidx_register_class)
{
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(operand);
    ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_MODRM);
    ZYAN_ASSERT(instruction->raw.modrm.mod != 3);
    ZYAN_ASSERT(!vidx_register_class || ((instruction->raw.modrm.rm == 4) &&
        ((instruction->address_width == 32) || (instruction->address_width == 64))));

    operand->type = ZYDIS_OPERAND_TYPE_MEMORY;
    operand->mem.type = ZYDIS_MEMOP_TYPE_MEM;

    const ZyanU8 modrm_rm = instruction->raw.modrm.rm;
    ZyanU8 displacement_size = 0;
    switch (instruction->address_width)
    {
    case 16:
    {
        static const ZydisRegister bases[] =
        {
            ZYDIS_REGISTER_BX,   ZYDIS_REGISTER_BX,   ZYDIS_REGISTER_BP,   ZYDIS_REGISTER_BP,
            ZYDIS_REGISTER_SI,   ZYDIS_REGISTER_DI,   ZYDIS_REGISTER_BP,   ZYDIS_REGISTER_BX
        };
        static const ZydisRegister indices[] =
        {
            ZYDIS_REGISTER_SI,   ZYDIS_REGISTER_DI,   ZYDIS_REGISTER_SI,   ZYDIS_REGISTER_DI,
            ZYDIS_REGISTER_NONE, ZYDIS_REGISTER_NONE, ZYDIS_REGISTER_NONE, ZYDIS_REGISTER_NONE
        };
        operand->mem.base = bases[modrm_rm];
        operand->mem.index = indices[modrm_rm];
        operand->mem.scale = (operand->mem.index == ZYDIS_REGISTER_NONE) ? 0 : 1;
        switch (instruction->raw.modrm.mod)
        {
        case 0:
            if (modrm_rm == 6)
            {
                displacement_size = 16;
                operand->mem.base = ZYDIS_REGISTER_NONE;
            }
            break;
        case 1:
            displacement_size = 8;
            break;
        case 2:
            displacement_size = 16;
            break;
        default:
            ZYAN_UNREACHABLE;
        }
        break;
    }
    case 32:
    {
        operand->mem.base = ZYDIS_REGISTER_EAX + ZydisCalcRegisterId(context, instruction,
            ZYDIS_REG_ENCODING_BASE, ZYDIS_REGCLASS_GPR32);
        switch (instruction->raw.modrm.mod)
        {
        case 0:
            if (modrm_rm == 5)
            {
                if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)
                {
                    operand->mem.base = ZYDIS_REGISTER_EIP;
                } else
                {
                    operand->mem.base = ZYDIS_REGISTER_NONE;
                }
                displacement_size = 32;
            }
            break;
        case 1:
            displacement_size = 8;
            break;
        case 2:
            displacement_size = 32;
            break;
        default:
            ZYAN_UNREACHABLE;
        }
        if (modrm_rm == 4)
        {
            ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_SIB);
            operand->mem.index =
                ZydisRegisterEncode(vidx_register_class ? vidx_register_class : ZYDIS_REGCLASS_GPR32,
                    ZydisCalcRegisterId(context, instruction,
                        vidx_register_class ? ZYDIS_REG_ENCODING_VIDX : ZYDIS_REG_ENCODING_INDEX,
                        vidx_register_class ? vidx_register_class : ZYDIS_REGCLASS_GPR32));
            operand->mem.scale = (1 << instruction->raw.sib.scale);
            if (operand->mem.index == ZYDIS_REGISTER_ESP)
            {
                operand->mem.index = ZYDIS_REGISTER_NONE;
                operand->mem.scale = 0;
            }
            if (operand->mem.base == ZYDIS_REGISTER_EBP)
            {
                if (instruction->raw.modrm.mod == 0)
                {
                    operand->mem.base = ZYDIS_REGISTER_NONE;
                }
                displacement_size = (instruction->raw.modrm.mod == 1) ? 8 : 32;
            }
        } else
        {
            operand->mem.index = ZYDIS_REGISTER_NONE;
            operand->mem.scale = 0;
        }
        break;
    }
    case 64:
    {
        operand->mem.base = ZYDIS_REGISTER_RAX + ZydisCalcRegisterId(context, instruction,
            ZYDIS_REG_ENCODING_BASE, ZYDIS_REGCLASS_GPR64);
        switch (instruction->raw.modrm.mod)
        {
        case 0:
            if (modrm_rm == 5)
            {
                if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)
                {
                    operand->mem.base = ZYDIS_REGISTER_RIP;
                } else
                {
                    operand->mem.base = ZYDIS_REGISTER_NONE;
                }
                displacement_size = 32;
            }
            break;
        case 1:
            displacement_size = 8;
            break;
        case 2:
            displacement_size = 32;
            break;
        default:
            ZYAN_UNREACHABLE;
        }
        if ((modrm_rm & 0x07) == 4)
        {
            ZYAN_ASSERT(instruction->attributes & ZYDIS_ATTRIB_HAS_SIB);
            operand->mem.index =
                ZydisRegisterEncode(vidx_register_class ? vidx_register_class : ZYDIS_REGCLASS_GPR64,
                    ZydisCalcRegisterId(context, instruction,
                        vidx_register_class ? ZYDIS_REG_ENCODING_VIDX : ZYDIS_REG_ENCODING_INDEX,
                        vidx_register_class ? vidx_register_class : ZYDIS_REGCLASS_GPR64));
            operand->mem.scale = (1 << instruction->raw.sib.scale);
            if (operand->mem.index == ZYDIS_REGISTER_RSP)
            {
                operand->mem.index = ZYDIS_REGISTER_NONE;
                operand->mem.scale = 0;
            }
            if ((operand->mem.base == ZYDIS_REGISTER_RBP) ||
                (operand->mem.base == ZYDIS_REGISTER_R13))
            {
                if (instruction->raw.modrm.mod == 0)
                {
                    operand->mem.base = ZYDIS_REGISTER_NONE;
                }
                displacement_size = (instruction->raw.modrm.mod == 1) ? 8 : 32;
            }
        } else
        {
            operand->mem.index = ZYDIS_REGISTER_NONE;
            operand->mem.scale = 0;
        }
        break;
    }
    default:
        ZYAN_UNREACHABLE;
    }
    if (displacement_size)
    {
        ZYAN_ASSERT(instruction->raw.disp.size == displacement_size);
        operand->mem.disp.value = instruction->raw.disp.value;
        operand->mem.disp.size = displacement_size;
        operand->mem.disp.offset = instruction->raw.disp.offset;
    }
    return ZYAN_STATUS_SUCCESS;
}